

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_utils.c
# Opt level: O0

int64_t rml_encode_key(char *key,int64_t prime_number)

{
  byte bVar1;
  size_t sVar2;
  int64_t code;
  int i;
  uint8_t current;
  int64_t code4;
  int64_t code3;
  int64_t code2;
  int64_t code1;
  int64_t length;
  int64_t prime_number_local;
  char *key_local;
  
  sVar2 = strlen(key);
  code2 = 1;
  code3 = 1;
  code4 = 1;
  _i = 1;
  for (code._0_4_ = 0; (long)(int)code < (long)sVar2; code._0_4_ = (int)code + 1) {
    bVar1 = key[(int)code];
    code2 = (ulong)bVar1 + code2;
    if ((int)code % 2 == 0) {
      code3 = (ulong)bVar1 + code3;
    }
    if ((int)code % 3 == 0) {
      code4 = (ulong)bVar1 + code4;
    }
    if ((int)code % 4 == 0) {
      _i = (ulong)bVar1 + _i;
    }
  }
  return (code2 * code3 * code4 * _i) % prime_number;
}

Assistant:

int64_t rml_encode_key(char *key, int64_t prime_number) {
    int64_t length = strlen(key);
    int64_t code1 = 1;
    int64_t code2 = 1;
    int64_t code3 = 1;
    int64_t code4 = 1;
    uint8_t current = 0;
    for (int i = 0; i < length; ++i) {
        current = key[i];
        code1 += current;
        if (i % 2 == 0) {
            code2 += current;
        }
        if (i % 3 == 0) {
            code3 += current;
        }
        if (i % 4 == 0) {
            code4 += current;
        }
    }
    int64_t code = (code1 * code2 * code3 * code4) % prime_number;
    return code;
}